

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC16NoLeft_SSE2(uint8_t *dst)

{
  uint8_t *in_RDI;
  undefined1 auVar1 [16];
  int DC;
  __m128i sum;
  __m128i sad8x2;
  __m128i top;
  __m128i zero;
  short local_78;
  short sStack_76;
  short sStack_70;
  short sStack_6e;
  
  auVar1 = psadbw(*(undefined1 (*) [16])(in_RDI + -0x20),ZEXT816(0));
  local_78 = auVar1._0_2_;
  sStack_76 = auVar1._2_2_;
  sStack_70 = auVar1._8_2_;
  sStack_6e = auVar1._10_2_;
  Put16_SSE2((uint8_t)(CONCAT22(sStack_76 + sStack_6e,local_78 + sStack_70) + 8 >> 4),in_RDI);
  return;
}

Assistant:

static void DC16NoLeft_SSE2(uint8_t* dst) {  // DC with left samples unavailable
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  const int DC = _mm_cvtsi128_si32(sum) + 8;
  Put16_SSE2(DC >> 4, dst);
}